

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int openDirectory(char *zFilename,int *pFd)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  int *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int fd;
  int ii;
  char zDirname [513];
  mode_t in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  uint f;
  undefined4 uVar4;
  int in_stack_fffffffffffffde4;
  int iVar5;
  char local_218 [136];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xffffffff;
  memset(local_218,0xaa,0x201);
  sqlite3_snprintf(0x200,local_218,"%s",in_RDI);
  sVar3 = strlen(local_218);
  iVar5 = (int)sVar3;
  while( true ) {
    f = in_stack_fffffffffffffdc4 & 0xffffff;
    if (0 < iVar5) {
      f = CONCAT13(local_218[iVar5] != '/',(int3)in_stack_fffffffffffffdc4);
    }
    if ((char)(f >> 0x18) == '\0') break;
    iVar5 = iVar5 + -1;
    in_stack_fffffffffffffdc4 = f;
  }
  if (iVar5 < 1) {
    if (local_218[0] != '/') {
      local_218[0] = '.';
    }
    local_218[1] = 0;
  }
  else {
    local_218[iVar5] = '\0';
  }
  iVar2 = robust_open((char *)CONCAT44(iVar5,uVar4),f,in_stack_fffffffffffffdc0);
  *in_RSI = iVar2;
  if (iVar2 < 0) {
    sqlite3CantopenError(0);
    iVar5 = unixLogErrorAtLine(in_stack_fffffffffffffde4,in_RDI,(char *)in_RSI,iVar5);
  }
  else {
    iVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}